

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resource.h
# Opt level: O2

UnicodeString * __thiscall
icu_63::ResourceValue::getUnicodeString
          (UnicodeString *__return_storage_ptr__,ResourceValue *this,UErrorCode *errorCode)

{
  int iVar1;
  undefined4 extraout_var;
  ConstChar16Ptr local_30 [3];
  int32_t len;
  
  len = 0;
  iVar1 = (*(this->super_UObject)._vptr_UObject[4])(this,&len);
  local_30[0].p_ = (char16_t *)CONCAT44(extraout_var,iVar1);
  UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',local_30,len);
  return __return_storage_ptr__;
}

Assistant:

inline UnicodeString getUnicodeString(UErrorCode &errorCode) const {
        int32_t len = 0;
        const UChar *r = getString(len, errorCode);
        return UnicodeString(TRUE, r, len);
    }